

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall httplib::ClientImpl::copy_settings(ClientImpl *this,ClientImpl *rhs)

{
  time_t tVar1;
  
  std::__cxx11::string::_M_assign((string *)&this->client_cert_path_);
  std::__cxx11::string::_M_assign((string *)&this->client_key_path_);
  this->connection_timeout_sec_ = rhs->connection_timeout_sec_;
  tVar1 = rhs->read_timeout_usec_;
  this->read_timeout_sec_ = rhs->read_timeout_sec_;
  this->read_timeout_usec_ = tVar1;
  tVar1 = rhs->write_timeout_usec_;
  this->write_timeout_sec_ = rhs->write_timeout_sec_;
  this->write_timeout_usec_ = tVar1;
  std::__cxx11::string::_M_assign((string *)&this->basic_auth_username_);
  std::__cxx11::string::_M_assign((string *)&this->basic_auth_password_);
  std::__cxx11::string::_M_assign((string *)&this->bearer_token_auth_token_);
  this->keep_alive_ = rhs->keep_alive_;
  this->follow_location_ = rhs->follow_location_;
  this->url_encode_ = rhs->url_encode_;
  this->address_family_ = rhs->address_family_;
  this->tcp_nodelay_ = rhs->tcp_nodelay_;
  std::function<void_(int)>::operator=(&this->socket_options_,&rhs->socket_options_);
  this->compress_ = rhs->compress_;
  this->decompress_ = rhs->decompress_;
  std::__cxx11::string::_M_assign((string *)&this->interface_);
  std::__cxx11::string::_M_assign((string *)&this->proxy_host_);
  this->proxy_port_ = rhs->proxy_port_;
  std::__cxx11::string::_M_assign((string *)&this->proxy_basic_auth_username_);
  std::__cxx11::string::_M_assign((string *)&this->proxy_basic_auth_password_);
  std::__cxx11::string::_M_assign((string *)&this->proxy_bearer_token_auth_token_);
  std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator=
            (&this->logger_,&rhs->logger_);
  return;
}

Assistant:

inline void ClientImpl::copy_settings(const ClientImpl &rhs) {
  client_cert_path_ = rhs.client_cert_path_;
  client_key_path_ = rhs.client_key_path_;
  connection_timeout_sec_ = rhs.connection_timeout_sec_;
  read_timeout_sec_ = rhs.read_timeout_sec_;
  read_timeout_usec_ = rhs.read_timeout_usec_;
  write_timeout_sec_ = rhs.write_timeout_sec_;
  write_timeout_usec_ = rhs.write_timeout_usec_;
  basic_auth_username_ = rhs.basic_auth_username_;
  basic_auth_password_ = rhs.basic_auth_password_;
  bearer_token_auth_token_ = rhs.bearer_token_auth_token_;
#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
  digest_auth_username_ = rhs.digest_auth_username_;
  digest_auth_password_ = rhs.digest_auth_password_;
#endif
  keep_alive_ = rhs.keep_alive_;
  follow_location_ = rhs.follow_location_;
  url_encode_ = rhs.url_encode_;
  address_family_ = rhs.address_family_;
  tcp_nodelay_ = rhs.tcp_nodelay_;
  socket_options_ = rhs.socket_options_;
  compress_ = rhs.compress_;
  decompress_ = rhs.decompress_;
  interface_ = rhs.interface_;
  proxy_host_ = rhs.proxy_host_;
  proxy_port_ = rhs.proxy_port_;
  proxy_basic_auth_username_ = rhs.proxy_basic_auth_username_;
  proxy_basic_auth_password_ = rhs.proxy_basic_auth_password_;
  proxy_bearer_token_auth_token_ = rhs.proxy_bearer_token_auth_token_;
#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
  proxy_digest_auth_username_ = rhs.proxy_digest_auth_username_;
  proxy_digest_auth_password_ = rhs.proxy_digest_auth_password_;
#endif
#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
  ca_cert_file_path_ = rhs.ca_cert_file_path_;
  ca_cert_dir_path_ = rhs.ca_cert_dir_path_;
  ca_cert_store_ = rhs.ca_cert_store_;
#endif
#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
  server_certificate_verification_ = rhs.server_certificate_verification_;
#endif
  logger_ = rhs.logger_;
}